

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-2.c
# Opt level: O1

int CheckBig(void)

{
  bool bVar1;
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  int n;
  uint b;
  undefined8 local_38;
  
  local_38 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    iVar3 = -1;
    pcVar2 = "can\'t open out.txt";
    goto LAB_00102b3e;
  }
  bVar1 = true;
  iVar3 = 3;
  do {
    pcVar2 = ScanInt((FILE *)__stream,(int *)&local_38);
    bVar6 = (uint)local_38 == 0;
    if (!bVar6 || pcVar2 != "PASSED") {
      bVar1 = false;
      printf("wrong output -- ");
    }
    bVar5 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while ((bVar6 && pcVar2 == "PASSED") && bVar5);
  uVar4 = 1;
  do {
    pcVar2 = ScanInt((FILE *)__stream,(int *)&local_38);
    bVar6 = uVar4 == (uint)local_38;
    if (!bVar6 || pcVar2 != "PASSED") {
      bVar1 = false;
      printf("wrong output -- ");
    }
    bVar5 = uVar4 != 4;
    uVar4 = uVar4 + 1;
  } while ((bVar6 && pcVar2 == "PASSED") && bVar5);
  if (bVar1) {
    bVar1 = true;
    uVar4 = 1;
    do {
      pcVar2 = ScanUintUint((FILE *)__stream,(uint *)&local_38,(uint *)((long)&local_38 + 4));
      if (((pcVar2 == "PASSED") && (uVar4 == (uint)local_38)) && (local_38._4_4_ == 8)) {
        bVar6 = false;
      }
      else {
        bVar1 = false;
        printf("wrong output -- ");
        bVar6 = true;
      }
    } while ((!bVar6) && (bVar6 = uVar4 != 0x3fffff9, uVar4 = uVar4 + 4, bVar6));
    if (!bVar1) goto LAB_00102b1c;
    iVar3 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar3 == 0) {
      iVar3 = 0;
      pcVar2 = "PASSED";
      goto LAB_00102b3e;
    }
  }
  else {
LAB_00102b1c:
    fclose(__stream);
  }
  iVar3 = 1;
  pcVar2 = "FAILED";
LAB_00102b3e:
  puts(pcVar2);
  testN = testN + 1;
  return iVar3;
}

Assistant:

static int CheckBig(void) {
    FILE *const out = fopen("out.txt", "r");
    int passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        ++testN;
        return -1;
    }

    for (int i = 0; i < 4; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || n != 0) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }

    for (int i = 1; i < 5; ++i) {
        int n;
        if (ScanInt(out, &n) != Pass || n != i) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }

    if (passed) {
        for (unsigned int i = 0; i < 1024 * 1024 * 8 * 2 - 1; ++i) {
            unsigned int a, b;
            if (ScanUintUint(out, &a, &b) != Pass || a != 1 + i * 4 || b != 8) {
                passed = 0;
                printf("wrong output -- ");
                break;
            }
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        ++testN;
        return 0;
    } else {
        printf("FAILED\n");
       ++testN;
        return 1;
    }
}